

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.h
# Opt level: O2

void __thiscall
libDAI::Box::Box(Box *this,VarSet *ns,
                vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *points)

{
  Prob *this_00;
  Prob *this_01;
  pointer pTVar1;
  undefined1 auVar2 [16];
  TProb<double> *pTVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  double p;
  undefined1 in_XMM2 [16];
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  VarSet::VarSet(&this->_vars,ns);
  this_00 = &this->_min;
  this_01 = &this->_max;
  (this->_min)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_max)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_max)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_max)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_min)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_min)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_min)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_max)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pTVar3 = (points->
           super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((points->super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish == pTVar3) {
    auVar2 = vcvtusi2sd_avx512f(in_XMM2,ns->_statespace);
    p = 1.0 / auVar2._0_8_;
    TProb<double>::TProb((TProb<double> *)&local_48,ns->_statespace,p);
    TProb<double>::operator=(this_00,(TProb<double> *)&local_48);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    TProb<double>::TProb((TProb<double> *)&local_48,ns->_statespace,p);
    TProb<double>::operator=(this_01,(TProb<double> *)&local_48);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  }
  else {
    pTVar3 = TProb<double>::operator=(this_01,pTVar3);
    TProb<double>::operator=(this_00,pTVar3);
    uVar5 = 1;
    lVar4 = 0x18;
    while( true ) {
      pTVar1 = (points->
               super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(points->
                         super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x18) <=
          uVar5) break;
      min<double>((TProb<double> *)&local_48,this_00,
                  (TProb<double> *)
                  ((long)&(pTVar1->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  lVar4));
      TProb<double>::operator=(this_00,(TProb<double> *)&local_48);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
      max<double>((TProb<double> *)&local_48,this_01,
                  (TProb<double> *)
                  ((long)&(((points->
                            super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_p).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl + lVar4));
      TProb<double>::operator=(this_01,(TProb<double> *)&local_48);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x18;
    }
  }
  return;
}

Assistant:

Box(const VarSet &ns, const std::vector<Prob> &points) : _vars(ns) {
                if( points.size() == 0 ) {
                    double x = 1.0 / ns.stateSpace();
                    _min = Prob(ns.stateSpace(), x);
                    _max = Prob(ns.stateSpace(), x);
                } else {
                    size_t N = ns.stateSpace();
                    assert( points[0].size() == N );
                    _min = _max = points[0];
                    for( size_t i = 1; i < points.size(); i++ ) {
                        assert( points[i].size() == N );
                        _min = libDAI::min( _min, points[i] );
                        _max = libDAI::max( _max, points[i] );
                    }
                }
            }